

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure_noabsolutepaths.c
# Opt level: O0

void test_write_disk_secure_noabsolutepaths(void)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  size_t sVar4;
  size_t sVar5;
  long v2;
  char *__s;
  la_ssize_t v2_00;
  char *v2_01;
  la_int64_t v2_02;
  char *local_2770;
  char *p;
  char *temp_absolute_file_name;
  size_t temp_absolute_file_name_length;
  size_t testworkdir_length;
  size_t entry_suffix_length;
  char *entry_suffix;
  size_t used;
  char buff [10000];
  archive_entry *local_20;
  archive_entry *ae;
  archive *ad;
  archive *a;
  
  ad = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L' ',(uint)(ad != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'!',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",ad);
  iVar1 = archive_write_add_filter_none(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",ad);
  iVar1 = archive_write_open_memory(ad,&used,10000,(size_t *)&entry_suffix);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'#',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",ad);
  sVar4 = strlen("/badfile");
  sVar5 = strlen(testworkdir);
  v2 = sVar5 + sVar4;
  __s = (char *)calloc(1,v2 + 1);
  iVar1 = snprintf(__s,v2 + 1,"%s%s",testworkdir,"/badfile");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L',',(long)iVar1,
                      "snprintf(temp_absolute_file_name, temp_absolute_file_name_length + 1, \"%s%s\", testworkdir, entry_suffix)"
                      ,v2,"temp_absolute_file_name_length",(void *)0x0);
  for (local_2770 = __s; *local_2770 != '\0'; local_2770 = local_2770 + 1) {
    if (*local_2770 == '\\') {
      *local_2770 = '/';
    }
  }
  local_20 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L'4',(uint)(local_20 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_20,__s);
  archive_entry_set_mode(local_20,0x81ff);
  archive_entry_set_size(local_20,6);
  iVar1 = archive_write_header(ad,local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ad);
  archive_entry_free(local_20);
  v2_00 = archive_write_data(ad,"hello",6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L':',6,"6",v2_00,"archive_write_data(a, \"hello\", 6)",(void *)0x0);
  iVar1 = archive_write_close(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ad);
  iVar1 = archive_write_free(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  ad = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L'?',(uint)(ad != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_format_all(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ad);
  iVar1 = archive_read_support_filter_all(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ad);
  iVar1 = archive_read_open_memory(ad,&used,(size_t)entry_suffix);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",ad)
  ;
  iVar1 = archive_read_next_header(ad,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ad);
  v2_01 = archive_entry_pathname(local_20);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
             ,L'E',__s,"temp_absolute_file_name",v2_01,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar2 = archive_entry_filetype(local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'F',0x8000,"AE_IFREG",(ulong)mVar2,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  mVar2 = archive_entry_mode(local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'G',0x81ff,"AE_IFREG | 0777",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2_02 = archive_entry_size(local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'H',6,"6",v2_02,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_extract(ad,local_20,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_read_extract(a, ae, 0)",(void *)0x0)
  ;
  unlink(__s);
  iVar1 = archive_read_extract(ad,local_20,0x10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L'O',(uint)(iVar1 != 0),
                   "ARCHIVE_OK != archive_read_extract(a, ae, ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS)"
                   ,(void *)0x0);
  ae = (archive_entry *)archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L'R',(uint)(ae != (archive_entry *)0x0),
                   "(ad = archive_write_disk_new()) != NULL",(void *)0x0);
  wVar3 = archive_write_disk_set_options((archive *)ae,L'𐀀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'S',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_write_disk_set_options(ad, ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS)",
                      (void *)0x0);
  iVar1 = archive_read_extract2(ad,local_20,(archive *)ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                   ,L'T',(uint)(iVar1 != 0),"ARCHIVE_OK != archive_read_extract2(a, ae, ad)",
                   (void *)0x0);
  iVar1 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  iVar1 = archive_read_free(ad);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure_noabsolutepaths.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure_noabsolutepaths)
{
	struct archive *a, *ad;
	struct archive_entry *ae;

	char buff[10000];

	size_t used;

	// Create an archive_write object.
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	// Create an absolute path for a test file inside testworkdir.
	const char *entry_suffix = "/badfile";
	size_t entry_suffix_length = strlen(entry_suffix);
	size_t testworkdir_length = strlen(testworkdir);
	size_t temp_absolute_file_name_length = testworkdir_length + entry_suffix_length;
	char *temp_absolute_file_name = calloc(1, temp_absolute_file_name_length + 1); // +1 for null character.
	assertEqualInt(snprintf(temp_absolute_file_name, temp_absolute_file_name_length + 1, "%s%s", testworkdir, entry_suffix),
		temp_absolute_file_name_length);

	// Convert to a unix-style path, so we can compare it to the entry
	// path when reading back the archive.
	for (char *p = temp_absolute_file_name; *p != '\0'; p++)
		if (*p == '\\') *p = '/';

	// Add a regular file entry with an absolute path.
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, temp_absolute_file_name);
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_entry_set_size(ae, 6);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(6, archive_write_data(a, "hello", 6));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	// Now try to extract the data.
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(temp_absolute_file_name, archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(AE_IFREG | 0777, archive_entry_mode(ae));
	assertEqualInt(6, archive_entry_size(ae));

	// This should succeed.
	assertEqualInt(ARCHIVE_OK, archive_read_extract(a, ae, 0));
	UNLINK(temp_absolute_file_name);

	// This should fail, since the archive entry has an absolute path.
	assert(ARCHIVE_OK != archive_read_extract(a, ae, ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS));

	// This should also fail.
	assert((ad = archive_write_disk_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_options(ad, ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS));
	assert(ARCHIVE_OK != archive_read_extract2(a, ae, ad));

	assertEqualInt(ARCHIVE_OK, archive_write_free(ad));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}